

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

FlagValue * __thiscall gflags::anon_unknown_2::FlagValue::New(FlagValue *this)

{
  FlagValue *pFVar1;
  undefined8 *puVar2;
  
  switch((ulong)this & 0xff) {
  case 0:
    pFVar1 = (FlagValue *)operator_new(0x10);
    puVar2 = (undefined8 *)operator_new(1);
    *(undefined1 *)puVar2 = 0;
    goto LAB_0010c35a;
  case 1:
    pFVar1 = (FlagValue *)operator_new(0x10);
    puVar2 = (undefined8 *)operator_new(4);
    goto LAB_0010c305;
  case 2:
    pFVar1 = (FlagValue *)operator_new(0x10);
    puVar2 = (undefined8 *)operator_new(4);
LAB_0010c305:
    *(undefined4 *)puVar2 = 0;
    goto LAB_0010c35a;
  case 3:
    pFVar1 = (FlagValue *)operator_new(0x10);
    puVar2 = (undefined8 *)operator_new(8);
    break;
  case 4:
    pFVar1 = (FlagValue *)operator_new(0x10);
    puVar2 = (undefined8 *)operator_new(8);
    break;
  case 5:
    pFVar1 = (FlagValue *)operator_new(0x10);
    puVar2 = (undefined8 *)operator_new(8);
    break;
  case 6:
    pFVar1 = (FlagValue *)operator_new(0x10);
    puVar2 = (undefined8 *)operator_new(0x20);
    *puVar2 = puVar2 + 2;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    goto LAB_0010c35a;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                  ,0x1d5,"FlagValue *gflags::(anonymous namespace)::FlagValue::New() const");
  }
  *puVar2 = 0;
LAB_0010c35a:
  pFVar1->value_buffer_ = puVar2;
  pFVar1->type_ = (int8)this;
  pFVar1->owns_value_ = true;
  return pFVar1;
}

Assistant:

FlagValue* FlagValue::New() const {
  switch (type_) {
    case FV_BOOL:   return new FlagValue(new bool(false), true);
    case FV_INT32:  return new FlagValue(new int32(0), true);
    case FV_UINT32: return new FlagValue(new uint32(0), true);
    case FV_INT64:  return new FlagValue(new int64(0), true);
    case FV_UINT64: return new FlagValue(new uint64(0), true);
    case FV_DOUBLE: return new FlagValue(new double(0.0), true);
    case FV_STRING: return new FlagValue(new string, true);
    default: assert(false); return NULL;  // unknown type
  }
}